

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

bool __thiscall cppforth::Forth::refillNextLine(Forth *this)

{
  ulong uVar1;
  bool bVar2;
  SCell SVar3;
  Cell CVar4;
  size_type sVar5;
  Cell blk;
  SCell sourceid_;
  Forth *this_local;
  
  requireDStackAvailable(this,1,"REFILLNEXTLINE");
  SVar3 = getSourceId(this);
  CVar4 = getDataCell(this,this->VarOffsetBlkAddress);
  if ((SVar3 < 0) || (CVar4 != 0)) {
    this_local._7_1_ = false;
  }
  else {
    this->inputBufferStringsCurrent = this->inputBufferStringsCurrent + 1;
    uVar1 = this->inputBufferStringsCurrent;
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->inputBufferStrings);
    if (uVar1 < sVar5) {
      bVar2 = setSourceBuffer(this);
      if (bVar2) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool refillNextLine() {
			REQUIRE_DSTACK_AVAILABLE(1, "REFILLNEXTLINE");
			auto sourceid_ = getSourceId();
			auto blk = getDataCell(VarOffsetBlkAddress);
			if (sourceid_ >= 0 and blk==0) { // if input from file or from input buffer
				inputBufferStringsCurrent++;
				if (inputBufferStringsCurrent < inputBufferStrings.size()) {
					if (setSourceBuffer()) {
						//std::cerr << inputBufferStrings[inputBufferStringsCurrent];
							
						return true;
					}
					else {
						return false;
					}
				}
				else {
					return false;
				}
			}
			else {
				return false; // input from EVALUATE and LOAD
			}
			
		}